

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpvector.hpp
# Opt level: O2

void __thiscall QpVector::sanitize(QpVector *this,double threshold)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  HighsInt i;
  long lVar4;
  int iVar5;
  long lVar6;
  
  piVar2 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = 0;
  for (lVar4 = 0; lVar4 < this->num_nz; lVar4 = lVar4 + 1) {
    iVar1 = piVar2[lVar4];
    if (ABS(pdVar3[iVar1]) <= threshold) {
      pdVar3[iVar1] = 0.0;
      piVar2[lVar4] = 0;
    }
    else {
      lVar6 = (long)iVar5;
      iVar5 = iVar5 + 1;
      piVar2[lVar6] = iVar1;
    }
  }
  this->num_nz = iVar5;
  return;
}

Assistant:

void sanitize(double threshold = 1e-14) {
    HighsInt new_idx = 0;

    for (HighsInt i = 0; i < num_nz; i++) {
      if (fabs(value[index[i]]) > threshold) {
        index[new_idx++] = index[i];
      } else {
        value[index[i]] = 0.0;
        index[i] = 0;
      }
    }
    num_nz = new_idx;
  }